

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

wstring * __thiscall
PDA::Transducer::Generator::pop_abi_cxx11_
          (wstring *__return_storage_ptr__,Generator *this,Register *dest,wchar_t suff)

{
  wstring wStack_38;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"pop",(allocator<wchar_t> *)&wStack_38);
  if ((int)dest == 0) {
    registerSuffix((Register *)this);
  }
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  Register::toString_abi_cxx11_(&wStack_38,(Register *)this);
  std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  std::__cxx11::wstring::~wstring((wstring *)&wStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::pop(const Register &dest, const wchar_t suff)
{
    std::wstring result = L"pop";
    result += suff == L'\0' ? registerSuffix(dest) : suff;
    result += L'\t';
    result += dest.toString();
    return result;
}